

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cpp
# Opt level: O3

char * loadfile(char *fn,int *size,bool utf8)

{
  uint dstlen;
  int iVar1;
  uint uVar2;
  stream *psVar3;
  uchar *dstbuf;
  uint uVar4;
  
  psVar3 = openrawfile(fn,"rb");
  if (psVar3 == (stream *)0x0) {
    return (char *)0x0;
  }
  dstlen = (*psVar3->_vptr_stream[7])(psVar3);
  if ((int)dstlen < 1) {
    (*psVar3->_vptr_stream[1])(psVar3);
    return (char *)0x0;
  }
  dstbuf = (uchar *)operator_new__((ulong)(dstlen + 1));
  uVar4 = 0;
  if (utf8 && 2 < dstlen) {
    uVar4 = 3;
    iVar1 = (*psVar3->_vptr_stream[9])(psVar3,dstbuf,3);
    if (iVar1 != 3) {
      (*psVar3->_vptr_stream[1])(psVar3);
      goto LAB_00159f43;
    }
    if ((*dstbuf == 0xef) && (dstbuf[1] == 0xbb)) {
      uVar4 = dstlen - 3;
      if (dstbuf[2] != 0xbf) {
        uVar4 = dstlen;
      }
      dstlen = uVar4;
      uVar4 = (uint)(dstbuf[2] != 0xbf) * 3;
    }
  }
  uVar2 = (*psVar3->_vptr_stream[9])(psVar3,dstbuf + uVar4,(ulong)(dstlen - uVar4));
  (*psVar3->_vptr_stream[1])(psVar3);
  if (uVar2 == dstlen - uVar4) {
    if (utf8) {
      dstlen = decodeutf8(dstbuf,dstlen,dstbuf,dstlen,(int *)0x0);
    }
    dstbuf[(int)dstlen] = '\0';
    if (size != (int *)0x0) {
      *size = dstlen;
      return (char *)dstbuf;
    }
    return (char *)dstbuf;
  }
LAB_00159f43:
  operator_delete__(dstbuf);
  return (char *)0x0;
}

Assistant:

char *loadfile(const char *fn, int *size, bool utf8)
{
    stream *f = openfile(fn, "rb");
    if(!f) return NULL;
    int len = (int)f->size();
    if(len <= 0) { delete f; return NULL; }
    char *buf = new char[len+1];
    if(!buf) { delete f; return NULL; }
    int offset = 0;
    if(utf8 && len >= 3)
    {
        if(f->read(buf, 3) != 3) { delete f; delete[] buf; return NULL; }
        if(((uchar *)buf)[0] == 0xEF && ((uchar *)buf)[1] == 0xBB && ((uchar *)buf)[2] == 0xBF) len -= 3;
        else offset += 3;
    }
    int rlen = f->read(&buf[offset], len-offset);
    delete f;
    if(rlen != len-offset) { delete[] buf; return NULL; }
    if(utf8) len = decodeutf8((uchar *)buf, len, (uchar *)buf, len);
    buf[len] = '\0';
    if(size!=NULL) *size = len;
    return buf;
}